

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  Snapshot snapshot;
  cmListFileBacktrace local_80;
  Snapshot local_40;
  
  cmState::Snapshot::Snapshot(&local_40,(cmState *)0x0);
  paVar1 = &local_80.Context.Name.field_2;
  local_80.Context.Name._M_string_length = 0;
  local_80.Context.Name.field_2._M_local_buf[0] = '\0';
  local_80.Context.Line = 0;
  snapshot.Position.Tree = local_40.Position.Tree;
  snapshot.State = local_40.State;
  snapshot.Position.Position = local_40.Position.Position;
  local_80.Context.Name._M_dataplus._M_p = (pointer)paVar1;
  cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__,snapshot,&local_80.Context);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.Context.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.Context.Name._M_dataplus._M_p,
                    CONCAT71(local_80.Context.Name.field_2._M_allocated_capacity._1_7_,
                             local_80.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  ppcVar2 = (this->ContextStack).
            super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start != ppcVar2) {
    cmListFileBacktrace::cmListFileBacktrace(&local_80,this->StateSnapshot,ppcVar2[-1]);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    (__return_storage_ptr__->Context).Line = local_80.Context.Line;
    (__return_storage_ptr__->Snapshot).State = local_80.Snapshot.State;
    (__return_storage_ptr__->Snapshot).Position.Tree = local_80.Snapshot.Position.Tree;
    (__return_storage_ptr__->Snapshot).Position.Position = local_80.Snapshot.Position.Position;
    cmListFileBacktrace::~cmListFileBacktrace(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  cmListFileBacktrace backtrace;
  if (!this->ContextStack.empty())
    {
    backtrace = cmListFileBacktrace(this->StateSnapshot,
                                    *this->ContextStack.back());
    }
  return backtrace;
}